

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O0

int Abc_NtkMinimumBase2(Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint Entry;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  int local_2c;
  int local_28;
  int Counter;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsBddLogic(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsBddLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcCollapse.c"
                  ,0x5f,"int Abc_NtkMinimumBase2(Abc_Ntk_t *)");
  }
  for (Counter = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), Counter < iVar1; Counter = Counter + 1) {
    pAVar2 = Abc_NtkObj(pNtk,Counter);
    if (pAVar2 != (Abc_Obj_t *)0x0) {
      Vec_IntClear(&pAVar2->vFanouts);
    }
  }
  local_2c = 0;
  for (Counter = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), Counter < iVar1; Counter = Counter + 1) {
    pAVar2 = Abc_NtkObj(pNtk,Counter);
    if ((pAVar2 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar2), iVar1 != 0)) {
      iVar1 = Abc_NodeMinimumBase2(pAVar2);
      local_2c = iVar1 + local_2c;
    }
  }
  for (Counter = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), Counter < iVar1; Counter = Counter + 1) {
    pAVar2 = Abc_NtkObj(pNtk,Counter);
    if (pAVar2 != (Abc_Obj_t *)0x0) {
      for (local_28 = 0; iVar1 = Abc_ObjFaninNum(pAVar2), local_28 < iVar1; local_28 = local_28 + 1)
      {
        pAVar3 = Abc_ObjFanin(pAVar2,local_28);
        Entry = Abc_ObjId(pAVar2);
        Vec_IntPush(&pAVar3->vFanouts,Entry);
      }
    }
  }
  return local_2c;
}

Assistant:

int Abc_NtkMinimumBase2( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode, * pFanin;
    int i, k, Counter;
    assert( Abc_NtkIsBddLogic(pNtk) );
    // remove all fanouts
    Abc_NtkForEachObj( pNtk, pNode, i )
        Vec_IntClear( &pNode->vFanouts );
    // add useful fanins
    Counter = 0;
    Abc_NtkForEachNode( pNtk, pNode, i )
        Counter += Abc_NodeMinimumBase2( pNode );
    // add fanouts
    Abc_NtkForEachObj( pNtk, pNode, i )
        Abc_ObjForEachFanin( pNode, pFanin, k )
            Vec_IntPush( &pFanin->vFanouts, Abc_ObjId(pNode) );
    return Counter;
}